

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  uint *puVar1;
  bool bVar2;
  CRef CVar3;
  anon_struct_4_5_613047fb_for_header *this_00;
  vec<unsigned_int,_int> *this_01;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  this_00 = (anon_struct_4_5_613047fb_for_header *)
            RegionAllocator<unsigned_int>::operator[](&(this->super_Solver).ca.ra,cr);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0xce,"bool Minisat::SimpSolver::strengthenClause(CRef, Lit)");
  }
  if (this->use_simplification != false) {
    Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
    if (((uint)*this_00 & 0xffffffe0) == 0x40) {
      removeClause(this,cr);
      Clause::strengthen((Clause *)this_00,l);
    }
    else {
      Solver::detachClause(&this->super_Solver,cr,true);
      Clause::strengthen((Clause *)this_00,l);
      Solver::attachClause(&this->super_Solver,cr);
      this_01 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
                operator[](&(this->occurs).occs,l.x >> 1);
      uVar6 = this_01->sz;
      puVar1 = this_01->data;
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar6) {
        uVar7 = (ulong)uVar6;
      }
      while( true ) {
        if (uVar7 == uVar5) {
          __assert_fail("j < (int)ts.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alg.h"
                        ,0x28,
                        "void Minisat::remove(V &, const T &) [V = Minisat::vec<unsigned int>, T = unsigned int]"
                       );
        }
        if (puVar1[uVar5] == cr) break;
        uVar5 = uVar5 + 1;
      }
      for (; (long)uVar5 < (long)(int)(uVar6 - 1); uVar5 = uVar5 + 1) {
        puVar1[uVar5] = puVar1[uVar5 + 1];
        uVar6 = this_01->sz;
      }
      vec<unsigned_int,_int>::pop(this_01);
      piVar4 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                         (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,l);
      *piVar4 = *piVar4 + -1;
      updateElimHeap(this,l.x >> 1);
    }
    bVar2 = true;
    if (((uint)*this_00 & 0xffffffe0) == 0x20) {
      bVar2 = Solver::enqueue(&this->super_Solver,(Lit)*(int *)(this_00 + 1),0xffffffff);
      if (bVar2) {
        CVar3 = Solver::propagate(&this->super_Solver);
        bVar2 = CVar3 == 0xffffffff;
      }
      else {
        bVar2 = false;
      }
    }
    return bVar2;
  }
  __assert_fail("use_simplification",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                ,0xcf,"bool Minisat::SimpSolver::strengthenClause(CRef, Lit)");
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[l]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}